

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned.h
# Opt level: O1

void __thiscall
intgemm::AlignedVector<float>::AlignedVector
          (AlignedVector<float> *this,size_t size,size_t alignment)

{
  int iVar1;
  undefined8 *puVar2;
  
  this->size_ = size;
  iVar1 = posix_memalign(&this->mem_,alignment,size * 4);
  if (iVar1 == 0) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &std::out_of_range::vtable;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

explicit AlignedVector(std::size_t size, std::size_t alignment = 64 /* CPU cares about this */)
      : size_(size) {
#ifdef _MSC_VER
      mem_ = static_cast<T*>(_aligned_malloc(size * sizeof(T), alignment));
      if (!mem_) {
#  if (defined(_MSC_VER) && !defined(__clang__)) ? (_HAS_EXCEPTIONS) : (__EXCEPTIONS)
        throw std::bad_alloc();
#  else
        std::abort();
#  endif
      }
#else
      if (posix_memalign(reinterpret_cast<void **>(&mem_), alignment, size * sizeof(T))) {
#  if (defined(_MSC_VER) && !defined(__clang__)) ? (_HAS_EXCEPTIONS) : (__EXCEPTIONS)
        throw std::bad_alloc();
#  else
        std::abort();
#  endif
      }
#endif
    }